

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O0

Abc_Obj_t * Abc_NtkCreateNodeConst0(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  DdNode *pDVar4;
  Hop_Obj_t *pHVar5;
  Mio_Library_t *pLib;
  Mio_Gate_t *pMVar6;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsLogic(pNtk);
  if ((iVar1 == 0) && (iVar1 = Abc_NtkIsNetlist(pNtk), iVar1 == 0)) {
    __assert_fail("Abc_NtkIsLogic(pNtk) || Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                  ,0x266,"Abc_Obj_t *Abc_NtkCreateNodeConst0(Abc_Ntk_t *)");
  }
  pAVar2 = Abc_NtkCreateNode(pNtk);
  iVar1 = Abc_NtkHasSop(pNtk);
  if ((iVar1 == 0) && (iVar1 = Abc_NtkHasBlifMv(pNtk), iVar1 == 0)) {
    iVar1 = Abc_NtkHasBdd(pNtk);
    if (iVar1 == 0) {
      iVar1 = Abc_NtkHasAig(pNtk);
      if (iVar1 == 0) {
        iVar1 = Abc_NtkHasMapping(pNtk);
        if (iVar1 == 0) {
          iVar1 = Abc_NtkHasBlackbox(pNtk);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                          ,0x273,"Abc_Obj_t *Abc_NtkCreateNodeConst0(Abc_Ntk_t *)");
          }
        }
        else {
          pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
          pMVar6 = Mio_LibraryReadConst0(pLib);
          (pAVar2->field_5).pData = pMVar6;
        }
      }
      else {
        pHVar5 = Hop_ManConst0((Hop_Man_t *)pNtk->pManFunc);
        (pAVar2->field_5).pData = pHVar5;
      }
    }
    else {
      pDVar4 = Cudd_ReadLogicZero((DdManager *)pNtk->pManFunc);
      (pAVar2->field_5).pData = pDVar4;
      Cudd_Ref((DdNode *)(pAVar2->field_5).pData);
    }
  }
  else {
    pcVar3 = Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc," 0\n");
    (pAVar2->field_5).pData = pcVar3;
  }
  return pAVar2;
}

Assistant:

Abc_Obj_t * Abc_NtkCreateNodeConst0( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    assert( Abc_NtkIsLogic(pNtk) || Abc_NtkIsNetlist(pNtk) );
    pNode = Abc_NtkCreateNode( pNtk );   
    if ( Abc_NtkHasSop(pNtk) || Abc_NtkHasBlifMv(pNtk) )
        pNode->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, " 0\n" );
#ifdef ABC_USE_CUDD
    else if ( Abc_NtkHasBdd(pNtk) )
        pNode->pData = Cudd_ReadLogicZero((DdManager *)pNtk->pManFunc), Cudd_Ref( (DdNode *)pNode->pData );
#endif
    else if ( Abc_NtkHasAig(pNtk) )
        pNode->pData = Hop_ManConst0((Hop_Man_t *)pNtk->pManFunc);
    else if ( Abc_NtkHasMapping(pNtk) )
        pNode->pData = Mio_LibraryReadConst0((Mio_Library_t *)Abc_FrameReadLibGen());
    else if ( !Abc_NtkHasBlackbox(pNtk) )
        assert( 0 );
    return pNode;
}